

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  SyntaxNode *args_4;
  ConditionalConstraintSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  SyntaxNode *local_60;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_38,
                      (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x58) == (SyntaxNode *)0x0) {
    local_60 = (SyntaxNode *)0x0;
  }
  else {
    local_60 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x58),(DeepCloneVisitor *)&local_60,
                          (BumpAllocator *)__child_stack);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalConstraintSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ConstraintItemSyntax&,slang::syntax::ElseConstraintClauseSyntax*>
                     ((BumpAllocator *)__child_stack,&local_48,&local_58,(ExpressionSyntax *)args_2,
                      &local_38,(ConstraintItemSyntax *)args_4,
                      (ElseConstraintClauseSyntax **)&local_60);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalConstraintSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalConstraintSyntax>(
        node.ifKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<ConstraintItemSyntax>(*node.constraints, alloc),
        node.elseClause ? deepClone(*node.elseClause, alloc) : nullptr
    );
}